

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

int __thiscall OpenSSLWrapper::SslConnection::SSLGetError(SslConnection *this,int iResult)

{
  int iVar1;
  
  std::mutex::lock(&this->m_mxSsl);
  iVar1 = SSL_get_error((SSL *)this->m_ssl,iResult);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
  return iVar1;
}

Assistant:

int SslConnection::SSLGetError(int iResult)
    {
        lock_guard<mutex> lk(m_mxSsl);
        return SSL_get_error(m_ssl, iResult);
    }